

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O2

int absl::(anonymous_namespace)::ConsumeDigits<16,unsigned_long>
              (char *begin,char *end,int max_digits,unsigned_long *out,bool *dropped_nonzero_digit)

{
  char *pcVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  byte *pbVar6;
  ulong uVar7;
  unsigned_long uVar8;
  
  if (0x10 < max_digits) {
    __assert_fail("max_digits * 4 <= std::numeric_limits<T>::digits",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_parse.cc"
                  ,0xfe,
                  "int absl::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 16, T = unsigned long]"
                 );
  }
  uVar8 = *out;
  for (lVar3 = 0; ((pcVar1 = begin + lVar3, uVar8 == 0 && (pcVar1 != end)) && (*pcVar1 == '0'));
      lVar3 = lVar3 + 1) {
  }
  pbVar6 = (byte *)(pcVar1 + (uint)max_digits);
  if ((long)(end + (-lVar3 - (long)begin)) <= (long)(ulong)(uint)max_digits) {
    pbVar6 = (byte *)end;
  }
  while( true ) {
    if ((pbVar6 <= begin + lVar3) ||
       (uVar4 = (ulong)(char)kAsciiToInt[(byte)begin[lVar3]], (long)uVar4 < 0)) {
      bVar5 = 0;
      while ((begin + lVar3 < end && (bVar2 = begin[lVar3], -1 < (char)kAsciiToInt[bVar2]))) {
        bVar5 = bVar5 | bVar2 != 0x30;
        lVar3 = lVar3 + 1;
      }
      if (!(bool)(~bVar5 & 1 | dropped_nonzero_digit == (bool *)0x0)) {
        *dropped_nonzero_digit = true;
      }
      *out = uVar8;
      return (int)lVar3;
    }
    uVar7 = uVar8 * 0x10;
    if (uVar7 < uVar8) {
      __assert_fail("accumulator * base >= accumulator",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_parse.cc"
                    ,0x10e,
                    "int absl::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 16, T = unsigned long]"
                   );
    }
    uVar8 = uVar7 + uVar4;
    if (CARRY8(uVar7,uVar4)) break;
    lVar3 = lVar3 + 1;
  }
  __assert_fail("accumulator + digit >= accumulator",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_parse.cc"
                ,0x110,
                "int absl::(anonymous namespace)::ConsumeDigits(const char *, const char *, int, T *, bool *) [base = 16, T = unsigned long]"
               );
}

Assistant:

int ConsumeDigits(const char* begin, const char* end, int max_digits, T* out,
                  bool* dropped_nonzero_digit) {
  if (base == 10) {
    assert(max_digits <= std::numeric_limits<T>::digits10);
  } else if (base == 16) {
    assert(max_digits * 4 <= std::numeric_limits<T>::digits);
  }
  const char* const original_begin = begin;

  // Skip leading zeros, but only if *out is zero.
  // They don't cause an overflow so we don't have to count them for
  // `max_digits`.
  while (!*out && end != begin && *begin == '0') ++begin;

  T accumulator = *out;
  const char* significant_digits_end =
      (end - begin > max_digits) ? begin + max_digits : end;
  while (begin < significant_digits_end && IsDigit<base>(*begin)) {
    // Do not guard against *out overflow; max_digits was chosen to avoid this.
    // Do assert against it, to detect problems in debug builds.
    auto digit = static_cast<T>(ToDigit<base>(*begin));
    assert(accumulator * base >= accumulator);
    accumulator *= base;
    assert(accumulator + digit >= accumulator);
    accumulator += digit;
    ++begin;
  }
  bool dropped_nonzero = false;
  while (begin < end && IsDigit<base>(*begin)) {
    dropped_nonzero = dropped_nonzero || (*begin != '0');
    ++begin;
  }
  if (dropped_nonzero && dropped_nonzero_digit != nullptr) {
    *dropped_nonzero_digit = true;
  }
  *out = accumulator;
  return static_cast<int>(begin - original_begin);
}